

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void SplitPoly(FPolyNode *pnode,void *node,float *bbox)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FPolySeg *pFVar5;
  FPolyNode *pnode_00;
  double dVar6;
  double dVar7;
  TArray<FPolySeg,_FPolySeg> *local_a8;
  uint local_9c;
  float fStack_98;
  uint i_1;
  float subbbox [4];
  subsector_t *sub;
  FPolyNode *newnode;
  FPolyVertex vert;
  int side2;
  int side1;
  int side_1;
  int side;
  double dist_v2;
  double dist_v1;
  FPolySeg *seg;
  uint i;
  int centerside;
  node_t *bsp;
  float *bbox_local;
  void *node_local;
  FPolyNode *pnode_local;
  
  if ((SplitPoly(FPolyNode*,void*,float*)::lists == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SplitPoly(FPolyNode*,void*,float*)::lists), iVar2 != 0)) {
    local_a8 = SplitPoly::lists;
    do {
      TArray<FPolySeg,_FPolySeg>::TArray(local_a8);
      local_a8 = local_a8 + 1;
    } while (local_a8 != (TArray<FPolySeg,_FPolySeg> *)&SplitPoly(FPolyNode*,void*,float*)::lists);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&SplitPoly(FPolyNode*,void*,float*)::lists);
  }
  if (((ulong)node & 1) == 0) {
    iVar2 = R_PointOnSide(&(pnode->poly->CenterSpot).pos,(node_t *)node);
    TArray<FPolySeg,_FPolySeg>::Clear(SplitPoly::lists);
    TArray<FPolySeg,_FPolySeg>::Clear(SplitPoly::lists + 1);
    for (seg._0_4_ = 0; uVar3 = TArray<FPolySeg,_FPolySeg>::Size(&pnode->segs), (uint)seg < uVar3;
        seg._0_4_ = (uint)seg + 1) {
      pFVar5 = TArray<FPolySeg,_FPolySeg>::operator[](&pnode->segs,(ulong)(uint)seg);
      dVar6 = PartitionDistance(&pFVar5->v1,(node_t *)node);
      dVar7 = PartitionDistance(&pFVar5->v2,(node_t *)node);
      if (0.3125 < dVar6) {
        if (0.3125 < dVar7) {
          vert.pos.Y._4_4_ = R_PointOnSide((DVector2 *)pFVar5,(node_t *)node);
          vert.pos.Y._0_4_ = R_PointOnSide(&(pFVar5->v2).pos,(node_t *)node);
          if (vert.pos.Y._4_4_ == vert.pos.Y._0_4_) {
            TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + vert.pos.Y._4_4_,pFVar5);
          }
          else {
            FPolyVertex::FPolyVertex((FPolyVertex *)&newnode);
            bVar1 = GetIntersection(pFVar5,(node_t *)node,(FPolyVertex *)&newnode);
            if (bVar1) {
              TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists,pFVar5);
              TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + 1,pFVar5);
              pFVar5 = TArray<FPolySeg,_FPolySeg>::Last(SplitPoly::lists + vert.pos.Y._4_4_);
              FPolyVertex::operator=(&pFVar5->v2,(FPolyVertex *)&newnode);
              pFVar5 = TArray<FPolySeg,_FPolySeg>::Last(SplitPoly::lists + vert.pos.Y._0_4_);
              FPolyVertex::operator=(&pFVar5->v1,(FPolyVertex *)&newnode);
            }
            else {
              TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + vert.pos.Y._4_4_,pFVar5);
            }
          }
        }
        else {
          iVar4 = R_PointOnSide((DVector2 *)pFVar5,(node_t *)node);
          TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + iVar4,pFVar5);
        }
      }
      else if (0.3125 < dVar7) {
        iVar4 = R_PointOnSide(&(pFVar5->v2).pos,(node_t *)node);
        TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + iVar4,pFVar5);
      }
      else {
        TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + iVar2,pFVar5);
      }
    }
    uVar3 = TArray<FPolySeg,_FPolySeg>::Size(SplitPoly::lists + 1);
    if (uVar3 == 0) {
      SplitPoly(pnode,*(void **)((long)node + 0x38),(float *)((long)node + 0x10));
      AddToBBox((float *)((long)node + 0x10),bbox);
    }
    else {
      uVar3 = TArray<FPolySeg,_FPolySeg>::Size(SplitPoly::lists);
      if (uVar3 == 0) {
        SplitPoly(pnode,*(void **)((long)node + 0x40),(float *)((long)node + 0x20));
        AddToBBox((float *)((long)node + 0x20),bbox);
      }
      else {
        pnode_00 = NewPolyNode();
        pnode_00->poly = pnode->poly;
        TArray<FPolySeg,_FPolySeg>::operator=(&pnode_00->segs,SplitPoly::lists + 1);
        TArray<FPolySeg,_FPolySeg>::operator=(&pnode->segs,SplitPoly::lists);
        SplitPoly(pnode_00,*(void **)((long)node + 0x40),(float *)((long)node + 0x20));
        SplitPoly(pnode,*(void **)((long)node + 0x38),(float *)((long)node + 0x10));
        AddToBBox((float *)((long)node + 0x10),bbox);
        AddToBBox((float *)((long)node + 0x20),bbox);
      }
    }
  }
  else {
    subbbox._8_8_ = (long)node + -1;
    pnode->pnext = *(FPolyNode **)((long)node + 7);
    if (pnode->pnext != (FPolyNode *)0x0) {
      if (pnode->pnext->state != 0x539) {
        __assert_fail("pnode->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x82a,"void SplitPoly(FPolyNode *, void *, float *)");
      }
      pnode->pnext->pprev = pnode;
    }
    pnode->pprev = (FPolyNode *)0x0;
    *(FPolyNode **)((long)node + 7) = pnode;
    pnode->snext = pnode->poly->subsectorlinks;
    pnode->poly->subsectorlinks = pnode;
    pnode->subsector = (subsector_t *)subbbox._8_8_;
    uVar3 = TArray<FPolySeg,_FPolySeg>::Size(&pnode->segs);
    if (uVar3 == 0) {
      __assert_fail("pnode->segs.Size() != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                    ,0x836,"void SplitPoly(FPolyNode *, void *, float *)");
    }
    _fStack_98 = 0x7f7fffff00800000;
    subbbox[0] = 3.4028235e+38;
    subbbox[1] = 1.1754944e-38;
    for (local_9c = 0; uVar3 = TArray<FPolySeg,_FPolySeg>::Size(&pnode->segs), local_9c < uVar3;
        local_9c = local_9c + 1) {
      pFVar5 = TArray<FPolySeg,_FPolySeg>::operator[](&pnode->segs,(ulong)local_9c);
      AddToBBox(&pFVar5->v1,&fStack_98);
      pFVar5 = TArray<FPolySeg,_FPolySeg>::operator[](&pnode->segs,(ulong)local_9c);
      AddToBBox(&pFVar5->v2,&fStack_98);
    }
    AddToBBox(&fStack_98,bbox);
  }
  return;
}

Assistant:

static void SplitPoly(FPolyNode *pnode, void *node, float bbox[4])
{
	static TArray<FPolySeg> lists[2];
	static const double POLY_EPSILON = 0.3125;

	if (!((size_t)node & 1))  // Keep going until found a subsector
	{
		node_t *bsp = (node_t *)node;

		int centerside = R_PointOnSide(pnode->poly->CenterSpot.pos, bsp);

		lists[0].Clear();
		lists[1].Clear();
		for(unsigned i=0;i<pnode->segs.Size(); i++)
		{
			FPolySeg *seg = &pnode->segs[i];

			// Parts of the following code were taken from Eternity and are
			// being used with permission.

			// get distance of vertices from partition line
			// If the distance is too small, we may decide to
			// change our idea of sidedness.
			double dist_v1 = PartitionDistance(&seg->v1, bsp);
			double dist_v2 = PartitionDistance(&seg->v2, bsp);

			// If the distances are less than epsilon, consider the points as being
			// on the same side as the polyobj origin. Why? People like to build
			// polyobject doors flush with their door tracks. This breaks using the
			// usual assumptions.
			

			// Addition to Eternity code: We must also check any seg with only one
			// vertex inside the epsilon threshold. If not, these lines will get split but
			// adjoining ones with both vertices inside the threshold won't thus messing up
			// the order in which they get drawn.

			if(dist_v1 <= POLY_EPSILON)
			{
				if (dist_v2 <= POLY_EPSILON)
				{
					lists[centerside].Push(*seg);
				}
				else
				{
					int side = R_PointOnSide(seg->v2.pos, bsp);
					lists[side].Push(*seg);
				}
			}
			else if (dist_v2 <= POLY_EPSILON)
			{
				int side = R_PointOnSide(seg->v1.pos, bsp);
				lists[side].Push(*seg);
			}
			else 
			{
				int side1 = R_PointOnSide(seg->v1.pos, bsp);
				int side2 = R_PointOnSide(seg->v2.pos, bsp);

				if(side1 != side2)
				{
					// if the partition line crosses this seg, we must split it.

					FPolyVertex vert;

					if (GetIntersection(seg, bsp, &vert))
					{
						lists[0].Push(*seg);
						lists[1].Push(*seg);
						lists[side1].Last().v2 = vert;
						lists[side2].Last().v1 = vert;
					}
					else
					{
						// should never happen
						lists[side1].Push(*seg);
					}
				}
				else 
				{
					// both points on the same side.
					lists[side1].Push(*seg);
				}
			}
		}
		if (lists[1].Size() == 0)
		{
			SplitPoly(pnode, bsp->children[0], bsp->bbox[0]);
			AddToBBox(bsp->bbox[0], bbox);
		}
		else if (lists[0].Size() == 0)
		{
			SplitPoly(pnode, bsp->children[1], bsp->bbox[1]);
			AddToBBox(bsp->bbox[1], bbox);
		}
		else
		{
			// create the new node 
			FPolyNode *newnode = NewPolyNode();
			newnode->poly = pnode->poly;
			newnode->segs = lists[1];

			// set segs for original node
			pnode->segs = lists[0];
		
			// recurse back side
			SplitPoly(newnode, bsp->children[1], bsp->bbox[1]);
			
			// recurse front side
			SplitPoly(pnode, bsp->children[0], bsp->bbox[0]);

			AddToBBox(bsp->bbox[0], bbox);
			AddToBBox(bsp->bbox[1], bbox);
		}
	}
	else
	{
		// we reached a subsector so we can link the node with this subsector
		subsector_t *sub = (subsector_t *)((BYTE *)node - 1);

		// Link node to subsector
		pnode->pnext = sub->polys;
		if (pnode->pnext != NULL) 
		{
			assert(pnode->pnext->state == 1337);
			pnode->pnext->pprev = pnode;
		}
		pnode->pprev = NULL;
		sub->polys = pnode;

		// link node to polyobject
		pnode->snext = pnode->poly->subsectorlinks;
		pnode->poly->subsectorlinks = pnode;
		pnode->subsector = sub;

		// calculate bounding box for this polynode
		assert(pnode->segs.Size() != 0);
		float subbbox[4] = { FLT_MIN, FLT_MAX, FLT_MAX, FLT_MIN };

		for (unsigned i = 0; i < pnode->segs.Size(); ++i)
		{
			AddToBBox(&pnode->segs[i].v1, subbbox);
			AddToBBox(&pnode->segs[i].v2, subbbox);
		}
		// Potentially expand the parent node's bounding box to contain these bits of polyobject.
		AddToBBox(subbbox, bbox);
	}
}